

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O2

void __thiscall ktxInfo::ktxInfo(ktxInfo *this)

{
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR_main_0011ca38;
  ktxApp::ktxApp(&this->super_ktxApp,&myversion_abi_cxx11_,&mydefversion_abi_cxx11_,&this->options);
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR_main_0011ca38;
  (this->options).infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options).outfile._M_dataplus._M_p = (pointer)&(this->options).outfile.field_2;
  (this->options).outfile._M_string_length = 0;
  (this->options).outfile.field_2._M_local_buf[0] = '\0';
  (this->options).test = 0;
  (this->options).warn = 1;
  (this->options).launchDebugger = 0;
  return;
}

Assistant:

ktxInfo::ktxInfo() : ktxApp(myversion, mydefversion, options)
{

}